

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::MergeMaterials
               (aiMaterial **dest,const_iterator begin,const_iterator end)

{
  char *pKey;
  aiMaterialProperty *paVar1;
  aiReturn aVar2;
  const_iterator it;
  aiMaterial *this;
  const_iterator cVar3;
  aiMaterialProperty **ppaVar4;
  aiMaterialProperty *this_00;
  char *__dest;
  uint uVar5;
  uint i;
  ulong uVar6;
  const_iterator it_1;
  aiMaterialProperty *prop_exist;
  
  if (dest != (aiMaterial **)0x0) {
    if (begin._M_current == end._M_current) {
      *dest = (aiMaterial *)0x0;
    }
    else {
      this = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this);
      *dest = this;
      uVar5 = 0;
      for (cVar3._M_current = begin._M_current; cVar3._M_current != end._M_current;
          cVar3._M_current = cVar3._M_current + 1) {
        uVar5 = uVar5 + (*cVar3._M_current)->mNumProperties;
      }
      aiMaterial::Clear(this);
      if (this->mProperties != (aiMaterialProperty **)0x0) {
        operator_delete__(this->mProperties);
      }
      this->mNumAllocated = uVar5;
      this->mNumProperties = 0;
      ppaVar4 = (aiMaterialProperty **)operator_new__((ulong)uVar5 << 3);
      this->mProperties = ppaVar4;
      for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
        for (uVar6 = 0; uVar6 < (*begin._M_current)->mNumProperties; uVar6 = uVar6 + 1) {
          paVar1 = (*begin._M_current)->mProperties[uVar6];
          pKey = (paVar1->mKey).data;
          aVar2 = aiGetMaterialProperty(this,pKey,paVar1->mSemantic,paVar1->mIndex,&prop_exist);
          if (aVar2 != aiReturn_SUCCESS) {
            this_00 = (aiMaterialProperty *)operator_new(0x420);
            aiMaterialProperty::aiMaterialProperty(this_00);
            this->mProperties[this->mNumProperties] = this_00;
            uVar5 = paVar1->mDataLength;
            this_00->mDataLength = uVar5;
            __dest = (char *)operator_new__((ulong)uVar5);
            this_00->mData = __dest;
            memcpy(__dest,paVar1->mData,(ulong)uVar5);
            this_00->mIndex = paVar1->mIndex;
            this_00->mSemantic = paVar1->mSemantic;
            if (this_00 != paVar1) {
              uVar5 = (paVar1->mKey).length;
              (this_00->mKey).length = uVar5;
              memcpy((this_00->mKey).data,pKey,(ulong)uVar5);
              (this_00->mKey).data[uVar5] = '\0';
            }
            this_00->mType = paVar1->mType;
            this->mNumProperties = this->mNumProperties + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMaterials(aiMaterial** dest,
        std::vector<aiMaterial*>::const_iterator begin,
        std::vector<aiMaterial*>::const_iterator end)
{
    if ( nullptr == dest ) {
        return;
    }

    if (begin == end)   {
        *dest = NULL; // no materials ...
        return;
    }

    // Allocate the output material
    aiMaterial* out = *dest = new aiMaterial();

    // Get the maximal number of properties
    unsigned int size = 0;
    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        size += (*it)->mNumProperties;
    }

    out->Clear();
    delete[] out->mProperties;

    out->mNumAllocated = size;
    out->mNumProperties = 0;
    out->mProperties = new aiMaterialProperty*[out->mNumAllocated];

    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        for(unsigned int i = 0; i < (*it)->mNumProperties; ++i) {
            aiMaterialProperty* sprop = (*it)->mProperties[i];

            // Test if we already have a matching property
            const aiMaterialProperty* prop_exist;
            if(aiGetMaterialProperty(out, sprop->mKey.C_Str(), sprop->mSemantic, sprop->mIndex, &prop_exist) != AI_SUCCESS) {
                // If not, we add it to the new material
                aiMaterialProperty* prop = out->mProperties[out->mNumProperties] = new aiMaterialProperty();

                prop->mDataLength = sprop->mDataLength;
                prop->mData = new char[prop->mDataLength];
                ::memcpy(prop->mData, sprop->mData, prop->mDataLength);

                prop->mIndex    = sprop->mIndex;
                prop->mSemantic = sprop->mSemantic;
                prop->mKey      = sprop->mKey;
                prop->mType     = sprop->mType;

                out->mNumProperties++;
            }
        }
    }
}